

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_cmpgt_s8(c_v256 a,c_v256 b)

{
  c_v256 cVar1;
  c_v256 *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = b.u64[2];
  auVar2 = vpcmpgtb_avx(auVar2,auVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a.u64[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = b.u64[3];
  auVar4 = vpcmpgtb_avx(auVar4,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = a.u64[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = b.u64[0];
  auVar6 = vpcmpgtb_avx(auVar8,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = a.u64[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = b.u64[1];
  auVar7 = vpcmpgtb_avx(auVar9,auVar11);
  auVar3._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar2;
  auVar3._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  auVar5._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar6;
  auVar5._16_16_ = ZEXT116(1) * auVar7;
  auVar3 = vpunpcklqdq_avx2(auVar5,auVar3);
  cVar1 = (c_v256)vpermq_avx2(auVar3,0xd8);
  *in_RDI = cVar1;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_cmpgt_s8(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_cmpgt_s8(a.v128[1], b.v128[1]),
                          c_v128_cmpgt_s8(a.v128[0], b.v128[0]));
}